

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_fixedarray(upb_encstate *e,upb_Array *arr,size_t elem_size,uint32_t tag)

{
  _Bool _Var1;
  size_t sVar2;
  uint64_t local_60;
  uint64_t val_1;
  uint64_t *puStack_50;
  uint32_t val;
  char *ptr;
  char *data;
  size_t bytes;
  size_t sStack_30;
  uint32_t tag_local;
  size_t elem_size_local;
  upb_Array *arr_local;
  upb_encstate *e_local;
  upb_Array *local_10;
  
  bytes._4_4_ = tag;
  sStack_30 = elem_size;
  elem_size_local = (size_t)arr;
  arr_local = (upb_Array *)e;
  sVar2 = upb_Array_Size(arr);
  data = (char *)(sVar2 * sStack_30);
  ptr = (char *)upb_Array_DataPtr((upb_Array *)elem_size_local);
  puStack_50 = (uint64_t *)(ptr + (long)data + -sStack_30);
  if ((bytes._4_4_ == 0) && (_Var1 = upb_IsLittleEndian(), _Var1)) {
    encode_bytes((upb_encstate *)arr_local,ptr,(size_t)data);
  }
  else {
    while( true ) {
      if (sStack_30 == 4) {
        val_1._4_4_ = (uint32_t)*puStack_50;
        val_1._4_4_ = upb_BigEndian32(val_1._4_4_);
        encode_bytes((upb_encstate *)arr_local,(void *)((long)&val_1 + 4),sStack_30);
      }
      else {
        if (sStack_30 != 8) {
          __assert_fail("elem_size == 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/wire/encode.c"
                        ,0xcc,
                        "void encode_fixedarray(upb_encstate *, const upb_Array *, size_t, uint32_t)"
                       );
        }
        local_60 = *puStack_50;
        local_60 = upb_BigEndian64(local_60);
        encode_bytes((upb_encstate *)arr_local,&local_60,sStack_30);
      }
      if (bytes._4_4_ != 0) {
        e_local = (upb_encstate *)(ulong)bytes._4_4_;
        local_10 = arr_local;
        if ((e_local < (upb_encstate *)0x80) &&
           (arr_local[9].size_dont_copy_me__upb_internal_use_only !=
            arr_local[9].data_dont_copy_me__upb_internal_use_only)) {
          arr_local[9].size_dont_copy_me__upb_internal_use_only =
               arr_local[9].size_dont_copy_me__upb_internal_use_only - 1;
          *(char *)arr_local[9].size_dont_copy_me__upb_internal_use_only = (char)bytes._4_4_;
        }
        else {
          encode_longvarint((upb_encstate *)arr_local,(uint64_t)e_local);
        }
      }
      if (puStack_50 == (uint64_t *)ptr) break;
      puStack_50 = (uint64_t *)((long)puStack_50 - sStack_30);
    }
  }
  return;
}

Assistant:

static void encode_fixedarray(upb_encstate* e, const upb_Array* arr,
                              size_t elem_size, uint32_t tag) {
  size_t bytes = upb_Array_Size(arr) * elem_size;
  const char* data = upb_Array_DataPtr(arr);
  const char* ptr = data + bytes - elem_size;

  if (tag || !upb_IsLittleEndian()) {
    while (true) {
      if (elem_size == 4) {
        uint32_t val;
        memcpy(&val, ptr, sizeof(val));
        val = upb_BigEndian32(val);
        encode_bytes(e, &val, elem_size);
      } else {
        UPB_ASSERT(elem_size == 8);
        uint64_t val;
        memcpy(&val, ptr, sizeof(val));
        val = upb_BigEndian64(val);
        encode_bytes(e, &val, elem_size);
      }

      if (tag) encode_varint(e, tag);
      if (ptr == data) break;
      ptr -= elem_size;
    }
  } else {
    encode_bytes(e, data, bytes);
  }
}